

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QSettingsGroup>::moveAppend
          (QGenericArrayOps<QSettingsGroup> *this,QSettingsGroup *b,QSettingsGroup *e)

{
  qsizetype *pqVar1;
  QSettingsGroup *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QSettingsGroup>).ptr;
    for (; b < e; b = b + 1) {
      QSettingsGroup::QSettingsGroup
                (pQVar2 + (this->super_QArrayDataPointer<QSettingsGroup>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QSettingsGroup>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }